

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O0

float __thiscall
poisson_loss::getUpdate
          (poisson_loss *this,float prediction,float label,float update_scale,float pred_per_update)

{
  float in_XMM0_Da;
  float fVar1;
  double dVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float exp_prediction;
  undefined4 local_4;
  
  fVar1 = expf(in_XMM0_Da);
  if (in_XMM1_Da <= 0.0) {
    dVar2 = std::log1p((double)(ulong)(uint)(fVar1 * in_XMM2_Da * in_XMM3_Da));
    local_4 = -SUB84(dVar2,0) / in_XMM3_Da;
  }
  else {
    dVar2 = std::expm1((double)(ulong)(uint)(in_XMM1_Da * in_XMM2_Da * in_XMM3_Da));
    dVar2 = std::log1p((double)(ulong)(uint)((fVar1 * SUB84(dVar2,0)) / in_XMM1_Da));
    local_4 = in_XMM1_Da * in_XMM2_Da + -(SUB84(dVar2,0) / in_XMM3_Da);
  }
  return local_4;
}

Assistant:

float getUpdate(float prediction, float label, float update_scale, float pred_per_update)
  {
    float exp_prediction = expf(prediction);
    if (label > 0)
    {
      return label * update_scale -
          log1p(exp_prediction * expm1(label * update_scale * pred_per_update) / label) / pred_per_update;
    }
    else
    {
      return -log1p(exp_prediction * update_scale * pred_per_update) / pred_per_update;
    }
  }